

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O0

void __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::flush_output
          (ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3> *this,int param_1)

{
  int param_1_local;
  ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3> *this_local;
  
  update_video(this);
  MOS::MOS6522::
  MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
  ::flush(&this->via_);
  Concurrency::AsyncTaskQueue<false,_true,_void>::perform(&(this->audio_).queue);
  JustInTimeActor<Apple::IWM,_HalfCycles,_1,_1>::flush(&this->iwm_);
  return;
}

Assistant:

void flush_output(int) {
			// Flush the video before the audio queue; in a Mac the
			// video is responsible for providing part of the
			// audio signal, so the two aren't as distinct as in
			// most machines.
			update_video();

			// As above: flush audio after video.
			via_.flush();
			audio_.queue.perform();

			// This avoids deferring IWM costs indefinitely, until
			// they become artbitrarily large.
			iwm_.flush();
		}